

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse::Clear(CodeGeneratorResponse *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  CodeGeneratorResponse *this_local;
  
  if ((((this->_has_bits_[0] & 0xff) != 0) && (bVar1 = has_error(this), bVar1)) &&
     (this->error_ != (string *)internal::kEmptyString_abi_cxx11_)) {
    std::__cxx11::string::clear();
  }
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Clear(&this->file_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void CodeGeneratorResponse::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_error()) {
      if (error_ != &::google::protobuf::internal::kEmptyString) {
        error_->clear();
      }
    }
  }
  file_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}